

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O2

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::SegmentClusterList
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,
          JitArenaAllocator *allocator,uint maxCount)

{
  uint **ppuVar1;
  
  this->maxIndex = maxCount + 0xf & 0xfffffff0;
  this->backingStore = (uint **)0x0;
  this->consolidated = true;
  this->alloc = allocator;
  ppuVar1 = Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int*,false>
                      ((Memory *)allocator,(JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero
                       ,0,(ulong)(maxCount + 0xf >> 4));
  this->backingStore = ppuVar1;
  return;
}

Assistant:

SegmentClusterList(TAllocator* allocator, indexType maxCount)
        : maxIndex(maxCount % numPerSegment == 0 ? maxCount : maxCount + (numPerSegment - (maxCount % numPerSegment)))
        , backingStore(nullptr)
        , alloc(allocator)
#if DBG
        , consolidated(true)
#endif
    {
        backingStore = AllocatorNewArrayZ(TAllocator, alloc, indexType*, maxIndex / numPerSegment);
    }